

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::_::
ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
::disposeImpl(ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
              *this,void *param_1,size_t param_2,size_t param_3,size_t param_4,
             _func_void_void_ptr *param_5)

{
  _func_void_void_ptr *param_5_local;
  size_t param_4_local;
  size_t param_3_local;
  size_t param_2_local;
  void *param_1_local;
  ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
  *this_local;
  
  if (this != (ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
               *)0x0) {
    ~ArrayDisposableOwnedBundle(this);
    operator_delete(this,0x40);
  }
  return;
}

Assistant:

void disposeImpl(void*, size_t, size_t, size_t, void (*)(void*)) const override { delete this; }